

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)77,(moira::Mode)9,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)9,_(moira::Size)2> *in_stack_00000008;
  StrWriter *in_stack_00000010;
  Ea<(moira::Mode)9,_(moira::Size)2> src;
  RegRegList dst;
  undefined6 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc6;
  Align align;
  undefined2 in_stack_ffffffffffffffcc;
  u16 in_stack_ffffffffffffffce;
  undefined6 in_stack_ffffffffffffffd0;
  RegRegList in_stack_ffffffffffffffd6;
  RegRegList local_1c [6];
  StrWriter *local_10;
  
  local_10 = in_RSI;
  uVar1 = dasmRead<(moira::Size)2>
                    ((Moira *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0),in_RDI);
  RegRegList::RegRegList(local_1c,(u16)uVar1);
  Op<(moira::Mode)9,(moira::Size)2>
            ((Moira *)CONCAT26(in_stack_ffffffffffffffd6.raw,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffce,
             (u32 *)CONCAT26(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0));
  pSVar2 = StrWriter::operator<<(local_10);
  pSVar2 = StrWriter::operator<<(pSVar2);
  align.raw = in_RDI[5];
  StrWriter::operator<<(pSVar2,align);
  pSVar2 = StrWriter::operator<<(in_stack_00000010,in_stack_00000008);
  StrWriter::operator<<(pSVar2,", ");
  StrWriter::operator<<
            ((StrWriter *)
             CONCAT26(in_stack_ffffffffffffffce,CONCAT24(in_stack_ffffffffffffffcc,align.raw)),
             in_stack_ffffffffffffffd6);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto dst = RegRegList ( dasmRead<Word>(addr)       );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}